

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

void Wln_ObjSetConst(Wln_Ntk_t *p,int iObj,int NameId)

{
  int iVar1;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar2;
  
  iVar1 = Wln_ObjIsConst(p,iObj);
  if (iVar1 != 0) {
    paVar2 = &p->vFanins[iObj].field_2;
    if (2 < p->vFanins[iObj].nSize) {
      paVar2 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar2->pArray[0];
    }
    paVar2->Array[0] = NameId;
    return;
  }
  __assert_fail("Wln_ObjIsConst(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                ,0x43,"void Wln_ObjSetConst(Wln_Ntk_t *, int, int)");
}

Assistant:

void Wln_ObjSetConst( Wln_Ntk_t * p, int iObj, int NameId )
{
    assert( Wln_ObjIsConst(p, iObj) );
    Wln_ObjSetFanin( p, iObj, 0, NameId );
}